

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall
FfsParser::parseBpdtRegion
          (FfsParser *this,UByteArray *region,UINT32 localOffset,UINT32 sbpdtOffsetFixup,
          UModelIndex *parent,UModelIndex *index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uchar **ppuVar2;
  uint uVar3;
  UINT32 UVar4;
  UINT32 UVar5;
  pointer pcVar6;
  TreeModel *pTVar7;
  bool bVar8;
  pointer pBVar9;
  size_type sVar10;
  UINT8 UVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  USTATUS UVar17;
  int iVar18;
  pointer pBVar19;
  long lVar20;
  uint *puVar21;
  long lVar22;
  vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> partitions;
  long local_2c0;
  undefined1 local_2b8 [16];
  _func_int *local_2a8;
  uint64_t uStack_2a0;
  TreeModel *local_298;
  UByteArray partition;
  UByteArray signature;
  UModelIndex entryIndex;
  CBString local_200;
  size_type local_1e0;
  ulong local_1d8;
  UINT32 local_1cc;
  UModelIndex partitionIndex;
  CBString info;
  CBString name;
  CBString text;
  CBString name_1;
  CBString info_1;
  CBString local_138;
  CBString local_120;
  CBString local_108;
  long local_f0;
  CBString local_e8;
  UByteArray header;
  CBString local_b0;
  CBString local_98;
  CBString local_80;
  CBString local_68;
  UByteArray body;
  
  local_1e0 = (region->d)._M_string_length;
  local_1cc = sbpdtOffsetFixup;
  if ((uint)local_1e0 < 0x18) {
    usprintf((CBString *)local_2b8,"%s: BPDT region too small to fit BPDT partition table header",
             "parseBpdtRegion");
    msg(this,(CBString *)local_2b8,parent);
  }
  else {
    pcVar6 = (region->d)._M_dataplus._M_p;
    uVar15 = (uint)*(ushort *)(pcVar6 + 4) * 0xc + 0x18;
    if (uVar15 <= (uint)local_1e0) {
      uVar12 = (uint)*(ushort *)(pcVar6 + 4) * 0xc;
      UByteArray::left(&header,region,0x18);
      UByteArray::mid(&body,region,0x18,uVar12);
      Bstrlib::CBString::CBString(&name,"BPDT partition table");
      local_1d8 = (ulong)(byte)pcVar6[6];
      usprintf(&info,
               "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nNumber of entries: %u\nVersion: %02Xh\nRedundancyFlag: %Xh\nIFWI version: %Xh\nFITC version: %u.%u.%u.%u"
               ,(ulong)uVar15,(ulong)uVar15,(ulong)(uint)header.d._M_string_length,
               (ulong)(uint)header.d._M_string_length,(ulong)uVar12,(ulong)uVar12,
               (ulong)*(ushort *)(pcVar6 + 4),local_1d8,(ulong)(byte)pcVar6[7],
               (ulong)*(uint *)(pcVar6 + 0xc),(ulong)*(ushort *)(pcVar6 + 0x10),
               (ulong)*(ushort *)(pcVar6 + 0x12),(ulong)*(ushort *)(pcVar6 + 0x14),
               (ulong)*(ushort *)(pcVar6 + 0x16));
      pTVar7 = this->model;
      Bstrlib::CBString::CBString((CBString *)&signature);
      local_2b8._8_8_ = 0;
      local_2a8 = (_func_int *)((ulong)local_2a8 & 0xffffffffffffff00);
      local_2b8._0_8_ = &local_2a8;
      TreeModel::addItem((UModelIndex *)&partition,pTVar7,localOffset,'\\','\0',&name,
                         (CBString *)&signature,&info,&header,&body,(UByteArray *)local_2b8,Fixed,
                         parent,'\0');
      index->m = (TreeModel *)partition.d.field_2._M_allocated_capacity;
      *(pointer *)index = partition.d._M_dataplus._M_p;
      index->i = CONCAT44(partition.d._M_string_length._4_4_,(uint)partition.d._M_string_length);
      if ((_func_int **)local_2b8._0_8_ != &local_2a8) {
        operator_delete((void *)local_2b8._0_8_);
      }
      Bstrlib::CBString::~CBString((CBString *)&signature);
      partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (*(ushort *)(pcVar6 + 4) == 0) {
        uVar12 = 0x18;
      }
      else {
        local_f0 = (ulong)*(ushort *)(pcVar6 + 4) * 0xc;
        local_1d8 = (ulong)(localOffset + 0x18);
        local_2c0 = 0;
        puVar21 = (uint *)(pcVar6 + 0x18);
        do {
          bpdtEntryTypeToUString((CBString *)local_2b8,(UINT16)*puVar21);
          Bstrlib::CBString::operator=(&name,(CBString *)local_2b8);
          Bstrlib::CBString::~CBString((CBString *)local_2b8);
          usprintf((CBString *)&partitionIndex,
                   "Full size: %Xh (%u)\nType: %Xh\nPartition offset: %Xh\nPartition length: %Xh",
                   0xc,0xc,(ulong)(ushort)*puVar21,(ulong)puVar21[1],(ulong)puVar21[2]);
          Bstrlib::CBString::CBString(&local_108,"\nSplit sub-partition first part: ");
          Bstrlib::CBString::operator+(&text,(CBString *)&partitionIndex,&local_108);
          pcVar16 = "Yes";
          if ((*puVar21 >> 0x10 & 1) == 0) {
            pcVar16 = "No";
          }
          Bstrlib::CBString::operator+(&info_1,&text,pcVar16);
          Bstrlib::CBString::CBString(&local_120,"\nSplit sub-partition second part: ");
          Bstrlib::CBString::operator+(&name_1,&info_1,&local_120);
          pcVar16 = "Yes";
          if ((*puVar21 >> 0x11 & 1) == 0) {
            pcVar16 = "No";
          }
          Bstrlib::CBString::operator+(&local_200,&name_1,pcVar16);
          Bstrlib::CBString::CBString(&local_e8,"\nCode sub-partition: ");
          Bstrlib::CBString::operator+((CBString *)&entryIndex,&local_200,&local_e8);
          pcVar16 = "Yes";
          if ((*puVar21 >> 0x12 & 1) == 0) {
            pcVar16 = "No";
          }
          Bstrlib::CBString::operator+((CBString *)&signature,(CBString *)&entryIndex,pcVar16);
          Bstrlib::CBString::CBString(&local_138,"\nUMA cacheable: ");
          Bstrlib::CBString::operator+((CBString *)&partition,(CBString *)&signature,&local_138);
          pcVar16 = "Yes";
          if ((*puVar21 >> 0x13 & 1) == 0) {
            pcVar16 = "No";
          }
          Bstrlib::CBString::operator+((CBString *)local_2b8,(CBString *)&partition,pcVar16);
          Bstrlib::CBString::operator=(&info,(CBString *)local_2b8);
          Bstrlib::CBString::~CBString((CBString *)local_2b8);
          Bstrlib::CBString::~CBString((CBString *)&partition);
          Bstrlib::CBString::~CBString(&local_138);
          Bstrlib::CBString::~CBString((CBString *)&signature);
          Bstrlib::CBString::~CBString((CBString *)&entryIndex);
          Bstrlib::CBString::~CBString(&local_e8);
          Bstrlib::CBString::~CBString(&local_200);
          Bstrlib::CBString::~CBString(&name_1);
          Bstrlib::CBString::~CBString(&local_120);
          Bstrlib::CBString::~CBString(&info_1);
          Bstrlib::CBString::~CBString(&text);
          Bstrlib::CBString::~CBString(&local_108);
          Bstrlib::CBString::~CBString((CBString *)&partitionIndex);
          pTVar7 = this->model;
          Bstrlib::CBString::CBString(&local_200);
          local_2b8._0_8_ = &local_2a8;
          local_2b8._8_8_ = 0;
          local_2a8 = (_func_int *)((ulong)local_2a8 & 0xffffffffffffff00);
          partition.d._M_dataplus._M_p = (pointer)&partition.d.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&partition,puVar21,puVar21 + 3);
          paVar1 = &signature.d.field_2;
          signature.d._M_string_length = 0;
          signature.d.field_2._M_local_buf[0] = '\0';
          signature.d._M_dataplus._M_p = (pointer)paVar1;
          TreeModel::addItem(&entryIndex,pTVar7,(int)local_1d8 + (int)local_2c0,']','\0',&name,
                             &local_200,&info,(UByteArray *)local_2b8,&partition,&signature,Fixed,
                             index,'\0');
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)signature.d._M_dataplus._M_p != paVar1) {
            operator_delete(signature.d._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)partition.d._M_dataplus._M_p != &partition.d.field_2) {
            operator_delete(partition.d._M_dataplus._M_p);
          }
          if ((_func_int **)local_2b8._0_8_ != &local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          Bstrlib::CBString::~CBString(&local_200);
          if ((1 < puVar21[1] + 1) && (puVar21[2] != 0)) {
            local_2b8[0xc] = 0x5e;
            local_2b8._8_4_ = puVar21[2];
            local_2b8._13_3_ = 0;
            local_2b8._4_4_ = (undefined4)((ulong)*(undefined8 *)puVar21 >> 0x20);
            local_2b8._0_4_ = (undefined4)*(undefined8 *)puVar21;
            local_2b8._4_4_ = local_2b8._4_4_ - local_1cc;
            local_298 = entryIndex.m;
            local_2a8 = (_func_int *)entryIndex._0_8_;
            uStack_2a0 = entryIndex.i;
            if (partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>::
              _M_realloc_insert<BPDT_PARTITION_INFO_const&>
                        ((vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>> *)
                         &partitions,
                         (iterator)
                         partitions.
                         super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (BPDT_PARTITION_INFO_ *)local_2b8);
            }
            else {
              ((partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_finish)->index).m = entryIndex.m;
              ((partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_finish)->index).r = entryIndex.r;
              ((partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_finish)->index).c = entryIndex.c;
              ((partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_finish)->index).i = entryIndex.i;
              *(undefined8 *)
               &(partitions.
                 super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->ptEntry = local_2b8._0_8_;
              *(undefined8 *)
               &((partitions.
                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->ptEntry).Size = local_2b8._8_8_;
              partitions.
              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   partitions.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          local_2c0 = local_2c0 + 0xc;
          puVar21 = puVar21 + 3;
        } while (local_f0 != local_2c0);
        uVar12 = (int)local_2c0 + 0x18;
      }
      sVar10 = local_1e0;
      if (partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_2a8 = (_func_int *)0xffffffffffffffff;
        uStack_2a0 = 0;
        local_298 = (TreeModel *)0x0;
        local_2b8._0_8_ = (ulong)uVar12 << 0x20;
        local_2b8[0xc] = 0x40;
        local_2b8._8_4_ = (int)(region->d)._M_string_length - uVar12;
        local_2b8._13_3_ = 0;
        if (partitions.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            partitions.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>::
          _M_realloc_insert<BPDT_PARTITION_INFO_const&>
                    ((vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>> *)
                     &partitions,
                     (iterator)
                     partitions.
                     super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(BPDT_PARTITION_INFO_ *)local_2b8);
        }
        else {
          ((partitions.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish)->index).m = (TreeModel *)0x0;
          ((partitions.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish)->index).r = -1;
          ((partitions.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish)->index).c = -1;
          ((partitions.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish)->index).i = 0;
          *(undefined8 *)
           &(partitions.
             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl
             .super__Vector_impl_data._M_finish)->ptEntry = local_2b8._0_8_;
          *(undefined8 *)
           &((partitions.
              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
              _M_impl.super__Vector_impl_data._M_finish)->ptEntry).Size = local_2b8._8_8_;
          partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               partitions.
               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      do {
        pBVar9 = partitions.
                 super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pBVar19 = partitions.
                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (partitions.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_start ==
            partitions.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          UVar17 = 0xfd;
          goto LAB_00119d92;
        }
        uVar13 = ((long)partitions.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)partitions.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        lVar20 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<BPDT_PARTITION_INFO_*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (partitions.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   partitions.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<BPDT_PARTITION_INFO_*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pBVar19,pBVar9);
        local_2b8._0_8_ = (_func_int **)0x0;
        local_2b8._8_8_ = 0;
        local_2a8 = (_func_int *)0xffffffffffffffff;
        uStack_2a0 = 0;
        local_298 = (TreeModel *)0x0;
        uVar12 = ((partitions.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset;
        if (uVar12 < uVar15) {
          usprintf((CBString *)&partition,
                   "%s: BPDT partition has intersection with BPDT partition table, skipped",
                   "parseBpdtRegion");
          msg(this,(CBString *)&partition,
              &(partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_start)->index);
          Bstrlib::CBString::~CBString((CBString *)&partition);
          pBVar19 = partitions.
                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
          if (pBVar19 !=
              partitions.
              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            memmove(partitions.
                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_start,pBVar19,
                    (long)partitions.
                          super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar19);
          }
          partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               partitions.
               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1;
          iVar18 = 5;
        }
        else {
          if (uVar15 < uVar12) {
            local_2b8._0_8_ = (ulong)uVar15 << 0x20;
            local_2b8[0xc] = 0x40;
            local_2b8._8_4_ =
                 ((partitions.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset - uVar15;
            local_2b8._13_3_ = 0;
            std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::insert
                      (&partitions,
                       (const_iterator)
                       partitions.
                       super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_2b8);
          }
          if (1 < (ulong)(((long)partitions.
                                 super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)partitions.
                                 super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x3333333333333333)) {
            uVar13 = 1;
            lVar22 = -0x50;
            lVar20 = 0;
            do {
              uVar12 = *(int *)((long)&((partitions.
                                         super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->ptEntry).Size +
                               lVar20) +
                       *(int *)((long)&((partitions.
                                         super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset
                               + lVar20);
              uVar14 = (ulong)*(uint *)((long)&partitions.
                                               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.
                                               Offset + lVar20);
              if ((sVar10 & 0xffffffff) <
                  *(uint *)((long)&partitions.
                                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Size +
                           lVar20) + uVar14) {
                if (uVar14 < (ulong)(long)(int)(region->d)._M_string_length) {
                  usprintf((CBString *)&partition,
                           "%s: BPDT partition can\'t fit into its region, truncated",
                           "parseBpdtRegion");
                  msg(this,(CBString *)&partition,
                      (UModelIndex *)
                      ((long)&partitions.
                              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar20));
                  Bstrlib::CBString::~CBString((CBString *)&partition);
                  *(int *)((long)&partitions.
                                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Size + lVar20
                          ) = (int)local_1e0 -
                              *(int *)((long)&partitions.
                                              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.
                                              Offset + lVar20);
                  goto LAB_001193c6;
                }
                usprintf((CBString *)&partition,
                         "%s: BPDT partition is located outside of the opened image, skipped",
                         "parseBpdtRegion");
                msg(this,(CBString *)&partition,
                    (UModelIndex *)
                    ((long)&partitions.
                            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar20));
LAB_001194b5:
                Bstrlib::CBString::~CBString((CBString *)&partition);
                pBVar19 = (pointer)(&partitions.
                                     super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[2].ptEntry.field_0x0
                                   + lVar20);
                if (pBVar19 !=
                    partitions.
                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  memmove(&partitions.
                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.field_0x0 + lVar20,
                          pBVar19,(long)partitions.
                                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                  (lVar22 - (long)partitions.
                                                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start));
                }
                partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     partitions.
                     super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
                bVar8 = false;
                iVar18 = 5;
              }
              else {
LAB_001193c6:
                uVar3 = *(uint *)((long)&partitions.
                                         super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Offset
                                 + lVar20);
                if (uVar3 < uVar12) {
                  if (uVar12 < uVar3 + *(int *)((long)&partitions.
                                                                                                              
                                                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  ptEntry.Size + lVar20)) {
                    usprintf((CBString *)&partition,
                             "%s: BPDT partition intersects with previous one, skipped",
                             "parseBpdtRegion");
                    msg(this,(CBString *)&partition,
                        (UModelIndex *)
                        ((long)&partitions.
                                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar20));
                  }
                  else {
                    usprintf((CBString *)&partition,
                             "%s: BPDT partition is located inside another BPDT partition, skipped",
                             "parseBpdtRegion");
                    msg(this,(CBString *)&partition,
                        (UModelIndex *)
                        ((long)&partitions.
                                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar20));
                  }
                  goto LAB_001194b5;
                }
                bVar8 = true;
                iVar18 = 0;
                if (uVar12 < uVar3) {
                  local_2b8._4_4_ = uVar12;
                  local_2b8[0xc] = 0x40;
                  local_2b8._8_4_ =
                       *(int *)((long)&partitions.
                                       super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Offset +
                               lVar20) - uVar12;
                  std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::insert
                            (&partitions,
                             (BPDT_PARTITION_INFO_ *)
                             (&partitions.
                               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.field_0x0 +
                             lVar20),(value_type *)local_2b8);
                  iVar18 = 0;
                }
              }
              if (!bVar8) goto LAB_0011953d;
              uVar13 = uVar13 + 1;
              lVar20 = lVar20 + 0x28;
              lVar22 = lVar22 + -0x28;
            } while (uVar13 < (ulong)(((long)partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x3333333333333333));
          }
          iVar18 = 6;
LAB_0011953d:
          if (iVar18 == 6) {
            if (partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              lVar20 = 0;
              uVar13 = 0;
              do {
                if ((&(partitions.
                       super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->type)[lVar20] == '@') {
                  UByteArray::mid(&partition,region,
                                  *(int32_t *)
                                   ((long)&((partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                           Offset + lVar20),
                                  *(int32_t *)
                                   ((long)&((partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                           Size + lVar20));
                  Bstrlib::CBString::CBString((CBString *)&signature,"Padding");
                  Bstrlib::CBString::operator=(&name,(CBString *)&signature);
                  Bstrlib::CBString::~CBString((CBString *)&signature);
                  usprintf((CBString *)&signature,"Full size: %Xh (%u)",
                           (ulong)(uint)partition.d._M_string_length);
                  Bstrlib::CBString::operator=(&info,(CBString *)&signature);
                  Bstrlib::CBString::~CBString((CBString *)&signature);
                  pTVar7 = this->model;
                  iVar18 = *(int *)((long)&((partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                           Offset + lVar20);
                  UVar11 = getPaddingType(&partition);
                  Bstrlib::CBString::CBString(&local_200);
                  signature.d._M_dataplus._M_p = (pointer)&signature.d.field_2;
                  signature.d._M_string_length = 0;
                  signature.d.field_2._M_local_buf[0] = '\0';
                  entryIndex.i = 0;
                  entryIndex.m = (TreeModel *)((ulong)entryIndex.m & 0xffffffffffffff00);
                  entryIndex._0_8_ = &entryIndex.m;
                  TreeModel::addItem((UModelIndex *)&name_1,pTVar7,iVar18 + localOffset,'@',UVar11,
                                     &name,&local_200,&info,&signature,&partition,
                                     (UByteArray *)&entryIndex,Fixed,parent,'\0');
                  if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
                    operator_delete((void *)entryIndex._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)signature.d._M_dataplus._M_p != &signature.d.field_2) {
                    operator_delete(signature.d._M_dataplus._M_p);
                  }
                  Bstrlib::CBString::~CBString(&local_200);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)partition.d._M_dataplus._M_p != &partition.d.field_2) {
                    operator_delete(partition.d._M_dataplus._M_p);
                  }
                }
                else if ((&(partitions.
                            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->type)[lVar20] == '^') {
                  bpdtEntryTypeToUString
                            (&name_1,*(UINT16 *)
                                      (&((partitions.
                                          super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                        field_0x0 + lVar20));
                  UByteArray::mid(&partition,region,
                                  *(int32_t *)
                                   ((long)&((partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                           Offset + lVar20),
                                  *(int32_t *)
                                   ((long)&((partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                           Size + lVar20));
                  UByteArray::left(&signature,&partition,4);
                  usprintf(&local_138,"Full size: %Xh (%u)\nType: %Xh",
                           (ulong)(uint)partition.d._M_string_length);
                  Bstrlib::CBString::CBString(&local_68,"\nSplit sub-partition first part: ");
                  Bstrlib::CBString::operator+(&local_e8,&local_138,&local_68);
                  pcVar16 = "Yes";
                  if ((*(uint *)(&((partitions.
                                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).field_0x0 +
                                lVar20) >> 0x10 & 1) == 0) {
                    pcVar16 = "No";
                  }
                  Bstrlib::CBString::operator+(&local_120,&local_e8,pcVar16);
                  Bstrlib::CBString::CBString(&local_80,"\nSplit sub-partition second part: ");
                  Bstrlib::CBString::operator+(&local_108,&local_120,&local_80);
                  pcVar16 = "Yes";
                  if ((*(uint *)(&((partitions.
                                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).field_0x0 +
                                lVar20) >> 0x11 & 1) == 0) {
                    pcVar16 = "No";
                  }
                  Bstrlib::CBString::operator+((CBString *)&partitionIndex,&local_108,pcVar16);
                  Bstrlib::CBString::CBString(&local_98,"\nCode sub-partition: ");
                  Bstrlib::CBString::operator+(&text,(CBString *)&partitionIndex,&local_98);
                  pcVar16 = "Yes";
                  if ((*(uint *)(&((partitions.
                                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).field_0x0 +
                                lVar20) >> 0x12 & 1) == 0) {
                    pcVar16 = "No";
                  }
                  Bstrlib::CBString::operator+(&local_200,&text,pcVar16);
                  Bstrlib::CBString::CBString(&local_b0,"\nUMA cacheable: ");
                  Bstrlib::CBString::operator+((CBString *)&entryIndex,&local_200,&local_b0);
                  pcVar16 = "Yes";
                  if ((*(uint *)(&((partitions.
                                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).field_0x0 +
                                lVar20) >> 0x13 & 1) == 0) {
                    pcVar16 = "No";
                  }
                  Bstrlib::CBString::operator+(&info_1,(CBString *)&entryIndex,pcVar16);
                  Bstrlib::CBString::~CBString((CBString *)&entryIndex);
                  Bstrlib::CBString::~CBString(&local_b0);
                  Bstrlib::CBString::~CBString(&local_200);
                  Bstrlib::CBString::~CBString(&text);
                  Bstrlib::CBString::~CBString(&local_98);
                  Bstrlib::CBString::~CBString((CBString *)&partitionIndex);
                  Bstrlib::CBString::~CBString(&local_108);
                  Bstrlib::CBString::~CBString(&local_80);
                  Bstrlib::CBString::~CBString(&local_120);
                  Bstrlib::CBString::~CBString(&local_e8);
                  Bstrlib::CBString::~CBString(&local_68);
                  Bstrlib::CBString::~CBString(&local_138);
                  bpdtEntryTypeToUString
                            (&text,*(UINT16 *)
                                    (&((partitions.
                                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                      field_0x0 + lVar20));
                  entryIndex._0_8_ = &entryIndex.m;
                  entryIndex.i = 0;
                  entryIndex.m = (TreeModel *)((ulong)entryIndex.m & 0xffffffffffffff00);
                  ppuVar2 = &local_200.super_tagbstring.data;
                  local_200.super_tagbstring.mlen = 0;
                  local_200.super_tagbstring.slen = 0;
                  local_200.super_tagbstring.data._0_1_ = 0;
                  local_200._vptr_CBString = (_func_int **)ppuVar2;
                  TreeModel::addItem(&partitionIndex,this->model,
                                     *(int *)((long)&((partitions.
                                                                                                              
                                                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  ptEntry).Offset + lVar20) + localOffset,'^','\0',
                                     &name_1,&text,&info_1,(UByteArray *)&entryIndex,&partition,
                                     (UByteArray *)&local_200,Fixed,parent,'\0');
                  if (local_200._vptr_CBString != (_func_int **)ppuVar2) {
                    operator_delete(local_200._vptr_CBString);
                  }
                  if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
                    operator_delete((void *)entryIndex._0_8_);
                  }
                  if (*(short *)(&((partitions.
                                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).field_0x0 +
                                lVar20) == 5) {
                    entryIndex.r = -1;
                    entryIndex.c = -1;
                    entryIndex.i = 0;
                    entryIndex.m = (TreeModel *)0x0;
                    parseBpdtRegion(this,&partition,0,
                                    *(UINT32 *)
                                     ((long)&((partitions.
                                               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                             Offset + lVar20),&partitionIndex,&entryIndex);
                  }
                  if (*(int *)partition.d._M_dataplus._M_p == 0x44504324) {
                    entryIndex.r = -1;
                    entryIndex.c = -1;
                    entryIndex.i = 0;
                    entryIndex.m = (TreeModel *)0x0;
                    parseCpdRegion(this,&partition,0,&partitionIndex,&entryIndex);
                  }
                  if (0x2d < (*(uint *)(&((partitions.
                                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                         field_0x0 + lVar20) & 0xfffe)) {
                    usprintf((CBString *)&entryIndex,"%s: BPDT entry of unknown type found",
                             "parseBpdtRegion");
                    msg(this,(CBString *)&entryIndex,&partitionIndex);
                    Bstrlib::CBString::~CBString((CBString *)&entryIndex);
                  }
                  Bstrlib::CBString::~CBString(&text);
                  Bstrlib::CBString::~CBString(&info_1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)signature.d._M_dataplus._M_p != &signature.d.field_2) {
                    operator_delete(signature.d._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)partition.d._M_dataplus._M_p != &partition.d.field_2) {
                    operator_delete(partition.d._M_dataplus._M_p);
                  }
                  Bstrlib::CBString::~CBString(&name_1);
                }
                uVar13 = uVar13 + 1;
                lVar20 = lVar20 + 0x28;
              } while (uVar13 < (ulong)(((long)partitions.
                                               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)partitions.
                                               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                       -0x3333333333333333));
            }
            uVar12 = partitions.
                     super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Offset;
            uVar3 = partitions.
                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Size;
            iVar18 = 1;
            if ((ulong)uVar3 + (ulong)uVar12 < (sVar10 & 0xffffffff)) {
              UByteArray::mid(&partition,region,
                              partitions.
                              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Size +
                              partitions.
                              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Offset,
                              (int)local_1e0 - (uVar3 + uVar12));
              Bstrlib::CBString::CBString((CBString *)&signature,"Padding");
              Bstrlib::CBString::operator=(&name,(CBString *)&signature);
              Bstrlib::CBString::~CBString((CBString *)&signature);
              usprintf((CBString *)&signature,"Full size: %Xh (%u)",
                       (ulong)(uint)partition.d._M_string_length);
              Bstrlib::CBString::operator=(&info,(CBString *)&signature);
              Bstrlib::CBString::~CBString((CBString *)&signature);
              pTVar7 = this->model;
              UVar4 = partitions.
                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Offset;
              UVar5 = partitions.
                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Size;
              UVar11 = getPaddingType(&partition);
              Bstrlib::CBString::CBString(&local_200);
              signature.d._M_dataplus._M_p = (pointer)&signature.d.field_2;
              signature.d._M_string_length = 0;
              signature.d.field_2._M_local_buf[0] = '\0';
              entryIndex._0_8_ = &entryIndex.m;
              entryIndex.i = 0;
              entryIndex.m = (TreeModel *)((ulong)entryIndex.m & 0xffffffffffffff00);
              TreeModel::addItem((UModelIndex *)&name_1,pTVar7,UVar4 + localOffset + UVar5,'@',
                                 UVar11,&name,&local_200,&info,&signature,&partition,
                                 (UByteArray *)&entryIndex,Fixed,parent,'\0');
              if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
                operator_delete((void *)entryIndex._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)signature.d._M_dataplus._M_p != &signature.d.field_2) {
                operator_delete(signature.d._M_dataplus._M_p);
              }
              Bstrlib::CBString::~CBString(&local_200);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)partition.d._M_dataplus._M_p != &partition.d.field_2) {
                operator_delete(partition.d._M_dataplus._M_p);
              }
            }
          }
        }
      } while (iVar18 == 5);
      UVar17 = 0;
LAB_00119d92:
      if (partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(partitions.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      Bstrlib::CBString::~CBString(&info);
      Bstrlib::CBString::~CBString(&name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)body.d._M_dataplus._M_p != &body.d.field_2) {
        operator_delete(body.d._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)header.d._M_dataplus._M_p == &header.d.field_2) {
        return UVar17;
      }
      operator_delete(header.d._M_dataplus._M_p);
      return UVar17;
    }
    usprintf((CBString *)local_2b8,"%s: BPDT region too small to fit BPDT partition table",
             "parseBpdtRegion");
    msg(this,(CBString *)local_2b8,parent);
  }
  Bstrlib::CBString::~CBString((CBString *)local_2b8);
  return 0xfd;
}

Assistant:

USTATUS FfsParser::parseBpdtRegion(const UByteArray & region, const UINT32 localOffset, const UINT32 sbpdtOffsetFixup, const UModelIndex & parent, UModelIndex & index)
{
    UINT32 regionSize = (UINT32)region.size();
    
    // Check region size
    if (regionSize < sizeof(BPDT_HEADER)) {
        msg(usprintf("%s: BPDT region too small to fit BPDT partition table header", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Populate partition table header
    const BPDT_HEADER* ptHeader = (const BPDT_HEADER*)(region.constData());
    
    // Check region size again
    UINT32 ptBodySize = ptHeader->NumEntries * sizeof(BPDT_ENTRY);
    UINT32 ptSize = sizeof(BPDT_HEADER) + ptBodySize;
    if (regionSize < ptSize) {
        msg(usprintf("%s: BPDT region too small to fit BPDT partition table", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Get info
    UByteArray header = region.left(sizeof(BPDT_HEADER));
    UByteArray body = region.mid(sizeof(BPDT_HEADER), ptBodySize);
    
    UString name = UString("BPDT partition table");
    UString info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\n"
                            "Number of entries: %u\nVersion: %02Xh\nRedundancyFlag: %Xh\n"
                            "IFWI version: %Xh\nFITC version: %u.%u.%u.%u",
                            ptSize, ptSize,
                            (UINT32)header.size(), (UINT32)header.size(),
                            ptBodySize, ptBodySize,
                            ptHeader->NumEntries,
                            ptHeader->HeaderVersion,
                            ptHeader->RedundancyFlag,
                            ptHeader->IfwiVersion,
                            ptHeader->FitcMajor, ptHeader->FitcMinor, ptHeader->FitcHotfix, ptHeader->FitcBuild);
    
    // Add tree item
    index = model->addItem(localOffset, Types::BpdtStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, parent);
    
    // Adjust offset
    UINT32 offset = sizeof(BPDT_HEADER);
    
    // Add partition table entries
    std::vector<BPDT_PARTITION_INFO> partitions;
    const BPDT_ENTRY* firstPtEntry = (const BPDT_ENTRY*)((const UINT8*)ptHeader + sizeof(BPDT_HEADER));
    UINT16 numEntries = ptHeader->NumEntries;
    for (UINT16 i = 0; i < numEntries; i++) {
        // Populate entry header
        const BPDT_ENTRY* ptEntry = firstPtEntry + i;
        
        // Get info
        name = bpdtEntryTypeToUString(ptEntry->Type);
        info = usprintf("Full size: %Xh (%u)\nType: %Xh\nPartition offset: %Xh\nPartition length: %Xh",
                        (UINT32)sizeof(BPDT_ENTRY), (UINT32)sizeof(BPDT_ENTRY),
                        ptEntry->Type,
                        ptEntry->Offset,
                        ptEntry->Size) +
        UString("\nSplit sub-partition first part: ") + (ptEntry->SplitSubPartitionFirstPart ? "Yes" : "No") +
        UString("\nSplit sub-partition second part: ") + (ptEntry->SplitSubPartitionSecondPart ? "Yes" : "No") +
        UString("\nCode sub-partition: ") + (ptEntry->CodeSubPartition ? "Yes" : "No") +
        UString("\nUMA cacheable: ") + (ptEntry->UmaCacheable ? "Yes" : "No");
        
        // Add tree item
        UModelIndex entryIndex = model->addItem(localOffset + offset, Types::BpdtEntry, 0, name, UString(), info, UByteArray(), UByteArray((const char*)ptEntry, sizeof(BPDT_ENTRY)), UByteArray(), Fixed, index);
        
        // Adjust offset
        offset += sizeof(BPDT_ENTRY);
        
        if (ptEntry->Offset != 0 && ptEntry->Offset != 0xFFFFFFFF && ptEntry->Size != 0) {
            // Add to partitions vector
            BPDT_PARTITION_INFO partition = {};
            partition.type = Types::BpdtPartition;
            partition.ptEntry = *ptEntry;
            partition.ptEntry.Offset -= sbpdtOffsetFixup;
            partition.index = entryIndex;
            partitions.push_back(partition);
        }
    }
    
    // Check for empty set of partitions
    if (partitions.empty()) {
        // Add a single padding partition in this case
        BPDT_PARTITION_INFO padding = {};
        padding.ptEntry.Offset = offset;
        padding.ptEntry.Size = (UINT32)(region.size() - padding.ptEntry.Offset);
        padding.type = Types::Padding;
        partitions.push_back(padding);
    }
    
make_partition_table_consistent:
    if (partitions.empty()) {
        return U_INVALID_ME_PARTITION_TABLE;
    }
    // Sort partitions by offset
    std::sort(partitions.begin(), partitions.end());
    
    // Check for intersections and paddings between partitions
    BPDT_PARTITION_INFO padding = {};
    
    // Check intersection with the partition table header
    if (partitions.front().ptEntry.Offset < ptSize) {
        msg(usprintf("%s: BPDT partition has intersection with BPDT partition table, skipped", __FUNCTION__),
            partitions.front().index);
        partitions.erase(partitions.begin());
        goto make_partition_table_consistent;
    }
    // Check for padding between partition table and the first partition
    else if (partitions.front().ptEntry.Offset > ptSize) {
        padding.ptEntry.Offset = ptSize;
        padding.ptEntry.Size = partitions.front().ptEntry.Offset - padding.ptEntry.Offset;
        padding.type = Types::Padding;
        partitions.insert(partitions.begin(), padding);
    }
    // Check for intersections/paddings between partitions
    for (size_t i = 1; i < partitions.size(); i++) {
        UINT32 previousPartitionEnd = partitions[i - 1].ptEntry.Offset + partitions[i - 1].ptEntry.Size;
        
        // Check that partition is fully present in the image
        if ((UINT64)partitions[i].ptEntry.Offset + (UINT64)partitions[i].ptEntry.Size > regionSize) {
            if ((UINT64)partitions[i].ptEntry.Offset >= (UINT64)region.size()) {
                msg(usprintf("%s: BPDT partition is located outside of the opened image, skipped", __FUNCTION__), partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: BPDT partition can't fit into its region, truncated", __FUNCTION__), partitions[i].index);
                partitions[i].ptEntry.Size = regionSize - (UINT32)partitions[i].ptEntry.Offset;
            }
        }
        
        // Check for intersection with previous partition
        if (partitions[i].ptEntry.Offset < previousPartitionEnd) {
            // Check if current partition is located inside previous one
            if (partitions[i].ptEntry.Offset + partitions[i].ptEntry.Size <= previousPartitionEnd) {
                msg(usprintf("%s: BPDT partition is located inside another BPDT partition, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: BPDT partition intersects with previous one, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
        }
        
        // Check for padding between current and previous partitions
        else if (partitions[i].ptEntry.Offset > previousPartitionEnd) {
            padding.ptEntry.Offset = previousPartitionEnd;
            padding.ptEntry.Size = partitions[i].ptEntry.Offset - previousPartitionEnd;
            padding.type = Types::Padding;
            std::vector<BPDT_PARTITION_INFO>::iterator iter = partitions.begin();
            std::advance(iter, i);
            partitions.insert(iter, padding);
        }
    }
    
    // Partition map is consistent
    for (size_t i = 0; i < partitions.size(); i++) {
        if (partitions[i].type == Types::BpdtPartition) {
            // Get info
            UString name = bpdtEntryTypeToUString(partitions[i].ptEntry.Type);
            UByteArray partition = region.mid(partitions[i].ptEntry.Offset, partitions[i].ptEntry.Size);
            UByteArray signature = partition.left(sizeof(UINT32));
            
            UString info = usprintf("Full size: %Xh (%u)\nType: %Xh",
                                    (UINT32)partition.size(), (UINT32)partition.size(),
                                    partitions[i].ptEntry.Type) +
            UString("\nSplit sub-partition first part: ") + (partitions[i].ptEntry.SplitSubPartitionFirstPart ? "Yes" : "No") +
            UString("\nSplit sub-partition second part: ") + (partitions[i].ptEntry.SplitSubPartitionSecondPart ? "Yes" : "No") +
            UString("\nCode sub-partition: ") + (partitions[i].ptEntry.CodeSubPartition ? "Yes" : "No") +
            UString("\nUMA cacheable: ") + (partitions[i].ptEntry.UmaCacheable ? "Yes" : "No");
            
            UString text = bpdtEntryTypeToUString(partitions[i].ptEntry.Type);
            
            // Add tree item
            UModelIndex partitionIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset, Types::BpdtPartition, 0, name, text, info, UByteArray(), partition, UByteArray(), Fixed, parent);
            
            // Special case of S-BPDT
            if (partitions[i].ptEntry.Type == BPDT_ENTRY_TYPE_S_BPDT) {
                UModelIndex sbpdtIndex;
                parseBpdtRegion(partition, 0, partitions[i].ptEntry.Offset, partitionIndex, sbpdtIndex); // Third parameter is a fixup for S-BPDT offset entries, because they are calculated from the start of BIOS region
            }
            
            // Parse code partitions
            if (readUnaligned((const UINT32*)partition.constData()) == CPD_SIGNATURE) {
                // Parse code partition contents
                UModelIndex cpdIndex;
                parseCpdRegion(partition, 0, partitionIndex, cpdIndex);
            }
            
            // Check for entry type to be known
            if (partitions[i].ptEntry.Type > BPDT_ENTRY_TYPE_PSEP) {
                msg(usprintf("%s: BPDT entry of unknown type found", __FUNCTION__), partitionIndex);
            }
        }
        else if (partitions[i].type == Types::Padding) {
            UByteArray padding = region.mid(partitions[i].ptEntry.Offset, partitions[i].ptEntry.Size);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)",
                            (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            model->addItem(localOffset + partitions[i].ptEntry.Offset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, parent);
        }
    }
    
    // Add padding after the last region
    if ((UINT64)partitions.back().ptEntry.Offset + (UINT64)partitions.back().ptEntry.Size < regionSize) {
        UINT64 usedSize = (UINT64)partitions.back().ptEntry.Offset + (UINT64)partitions.back().ptEntry.Size;
        UByteArray padding = region.mid(partitions.back().ptEntry.Offset + partitions.back().ptEntry.Size, (int)(regionSize - usedSize));
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)",
                        (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(localOffset + partitions.back().ptEntry.Offset + partitions.back().ptEntry.Size, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, parent);
    }
    
    return U_SUCCESS;
}